

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

void Cnf_AddCardinConstrMerge(sat_solver *p,int *pVars,int lo,int hi,int r,int *pnVars)

{
  int r_00;
  int hi_00;
  int k;
  int lo_00;
  
  r_00 = r * 2;
  if (r_00 < hi - lo) {
    hi_00 = hi - r;
    Cnf_AddCardinConstrMerge(p,pVars,lo,hi_00,r_00,pnVars);
    lo_00 = r + lo;
    Cnf_AddCardinConstrMerge(p,pVars,lo_00,hi,r_00,pnVars);
    if (lo_00 < hi_00) {
      k = lo + r_00;
      do {
        Cnf_AddSorder(p,pVars,lo_00,k,pnVars);
        lo_00 = lo_00 + r_00;
        k = k + r_00;
      } while (lo_00 < hi_00);
    }
  }
  return;
}

Assistant:

static inline void Cnf_AddCardinConstrMerge( sat_solver * p, int * pVars, int lo, int hi, int r, int * pnVars )
{
    int i, step = r * 2;
    if ( step < hi - lo )
    {
        Cnf_AddCardinConstrMerge( p, pVars, lo, hi-r, step, pnVars );
        Cnf_AddCardinConstrMerge( p, pVars, lo+r, hi, step, pnVars );
        for ( i = lo+r; i < hi-r; i += step )
            Cnf_AddSorder( p, pVars, i, i+r, pnVars );
    }
}